

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O3

void __thiscall
sglr::ReferenceContext::bindFramebuffer(ReferenceContext *this,deUint32 target,deUint32 name)

{
  int *piVar1;
  _Rb_tree_header *p_Var2;
  undefined8 *puVar3;
  _Base_ptr p_Var4;
  Framebuffer *pFVar5;
  long lVar6;
  ulong uVar7;
  _Base_ptr p_Var8;
  byte bVar9;
  deUint32 name_1;
  uint uVar10;
  bool bVar11;
  pair<unsigned_int,_sglr::rc::Framebuffer_*> local_40;
  
  if ((1 < target - 0x8ca8) && (target != 0x8d40)) {
    if (this->m_lastError != 0) {
      return;
    }
    this->m_lastError = 0x500;
    return;
  }
  if (name == 0) {
    pFVar5 = (Framebuffer *)0x0;
  }
  else {
    p_Var8 = (this->m_framebuffers).m_objects._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
    ;
    if (p_Var8 != (_Base_ptr)0x0) {
      p_Var2 = &(this->m_framebuffers).m_objects._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = &p_Var2->_M_header;
      do {
        bVar11 = p_Var8[1]._M_color < name;
        if (!bVar11) {
          p_Var4 = p_Var8;
        }
        p_Var8 = (&p_Var8->_M_left)[bVar11];
      } while (p_Var8 != (_Base_ptr)0x0);
      if ((((_Rb_tree_header *)p_Var4 != p_Var2) && (p_Var4[1]._M_color <= name)) &&
         (pFVar5 = (Framebuffer *)p_Var4[1]._M_parent, pFVar5 != (Framebuffer *)0x0))
      goto LAB_009855e0;
    }
    pFVar5 = (Framebuffer *)operator_new(0x50);
    (pFVar5->super_NamedObject).m_name = name;
    (pFVar5->super_NamedObject).m_refCount = 1;
    (pFVar5->super_NamedObject)._vptr_NamedObject = (_func_int **)&PTR__Framebuffer_00d2ecf8;
    lVar6 = 0x20;
    do {
      puVar3 = (undefined8 *)((long)pFVar5->m_attachments + lVar6 + -0x20);
      *puVar3 = 2;
      puVar3[1] = 10;
      *(undefined4 *)((long)pFVar5->m_attachments + lVar6 + -0x10) = 0;
      lVar6 = lVar6 + 0x14;
    } while (lVar6 != 0x5c);
    if ((this->m_framebuffers).m_lastName < name) {
      (this->m_framebuffers).m_lastName = name;
    }
    local_40.first = name;
    local_40.second = pFVar5;
    std::
    _Rb_tree<unsigned_int,std::pair<unsigned_int_const,sglr::rc::Framebuffer*>,std::_Select1st<std::pair<unsigned_int_const,sglr::rc::Framebuffer*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,sglr::rc::Framebuffer*>>>
    ::_M_emplace_unique<std::pair<unsigned_int,sglr::rc::Framebuffer*>>
              ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,sglr::rc::Framebuffer*>,std::_Select1st<std::pair<unsigned_int_const,sglr::rc::Framebuffer*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,sglr::rc::Framebuffer*>>>
                *)&(this->m_framebuffers).m_objects,&local_40);
  }
LAB_009855e0:
  uVar10 = 1;
  do {
    bVar9 = (byte)uVar10;
    if (target == 0x8d40 || (uVar10 ^ 0x8ca9) == target) {
      uVar7 = (ulong)((byte)~bVar9 & 1);
      if (*(long *)((this->m_clearColor).m_data + uVar7 * 2 + -0x1a) != 0) {
        lVar6 = 0x10;
        do {
          releaseFboAttachmentReference
                    (this,(Attachment *)
                          (*(long *)((this->m_clearColor).m_data + uVar7 * 2 + -0x1a) + lVar6));
          lVar6 = lVar6 + 0x14;
        } while (lVar6 != 0x4c);
        rc::ObjectManager<sglr::rc::Framebuffer>::releaseReference
                  (&this->m_framebuffers,
                   *(Framebuffer **)((this->m_clearColor).m_data + uVar7 * 2 + -0x1a));
      }
      if (pFVar5 != (Framebuffer *)0x0) {
        piVar1 = &(pFVar5->super_NamedObject).m_refCount;
        *piVar1 = *piVar1 + 1;
        lVar6 = 0;
        do {
          acquireFboAttachmentReference
                    (this,(Attachment *)((long)&pFVar5->m_attachments[0].type + lVar6));
          lVar6 = lVar6 + 0x14;
        } while (lVar6 != 0x3c);
      }
      *(Framebuffer **)((this->m_clearColor).m_data + uVar7 * 2 + -0x1a) = pFVar5;
    }
    uVar10 = 0;
  } while (bVar9 != 0);
  return;
}

Assistant:

void ReferenceContext::bindFramebuffer (deUint32 target, deUint32 name)
{
	Framebuffer* fbo = DE_NULL;

	RC_IF_ERROR(target != GL_FRAMEBUFFER		&&
				target != GL_DRAW_FRAMEBUFFER	&&
				target != GL_READ_FRAMEBUFFER, GL_INVALID_ENUM, RC_RET_VOID);

	if (name != 0)
	{
		// Find or create framebuffer object.
		fbo = m_framebuffers.find(name);
		if (!fbo)
		{
			fbo = new Framebuffer(name);
			m_framebuffers.insert(fbo);
		}
	}

	for (int ndx = 0; ndx < 2; ndx++)
	{
		deUint32			bindingTarget	= ndx ? GL_DRAW_FRAMEBUFFER			: GL_READ_FRAMEBUFFER;
		rc::Framebuffer*&	binding			= ndx ? m_drawFramebufferBinding	: m_readFramebufferBinding;

		if (target != GL_FRAMEBUFFER && target != bindingTarget)
			continue; // Doesn't match this target.

		// Remove old references
		if (binding)
		{
			// Clear all attachment point references
			for (int point = 0; point < Framebuffer::ATTACHMENTPOINT_LAST; point++)
				releaseFboAttachmentReference(binding->getAttachment((Framebuffer::AttachmentPoint)point));

			m_framebuffers.releaseReference(binding);
		}

		// Create new references
		if (fbo)
		{
			m_framebuffers.acquireReference(fbo);

			for (int point = 0; point < Framebuffer::ATTACHMENTPOINT_LAST; point++)
				acquireFboAttachmentReference(fbo->getAttachment((Framebuffer::AttachmentPoint)point));
		}

		binding = fbo;
	}
}